

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  int *idata;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type != FLAT_VECTOR) {
    if (input->vector_type == CONSTANT_VECTOR) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
        local_70.data = (data_ptr_t)&input->validity;
        local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        local_70.sel = (SelectionVector *)aggr_input_data;
        QuantileOperation::
        ConstantOperation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<int,true>>
                  ((QuantileState<int,_duckdb::QuantileStandardType> *)state,(int *)input->data,
                   (AggregateUnaryInput *)&local_70,count);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
      Vector::ToUnifiedFormat(input,count,&local_70);
      UnaryUpdateLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
                ((int *)local_70.data,aggr_input_data,
                 (QuantileState<int,_duckdb::QuantileStandardType> *)state,count,&local_70.validity,
                 local_70.sel);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
    }
    return;
  }
  idata = (int *)input->data;
  FlatVector::VerifyFlatVector(input);
  UnaryFlatUpdateLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
            (idata,aggr_input_data,(QuantileState<int,_duckdb::QuantileStandardType> *)state,count,
             &input->validity);
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}